

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O1

void __thiscall
pbrt::PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,CameraBaseParameters *baseParameters,Float fov,
          Bounds2f *screenWindow,Float lensRadius,Float focalDistance)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  Float FVar8;
  Float FVar9;
  Float FVar10;
  Float FVar11;
  Float FVar12;
  Float FVar13;
  float fVar14;
  undefined8 uVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  uintptr_t iptr;
  undefined1 uVar23;
  byte bVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float y;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auStack_428 [8];
  Float local_420;
  Float local_41c;
  Float local_418;
  CameraHandle local_400;
  Transform local_3f8;
  CameraBaseParameters local_378;
  
  auVar28 = in_ZMM26._0_16_;
  bVar24 = &stack0x00000000 == (undefined1 *)0x428;
  uVar23 = (POPCOUNT((ulong)auStack_428 & 0xff) & 1U) == 0;
  local_420 = fov;
  local_41c = lensRadius;
  local_418 = focalDistance;
  memcpy(&local_378,baseParameters,0x340);
  local_378.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (baseParameters->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_378.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(baseParameters->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  Perspective(&local_3f8,local_420,0.01,1000.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,&local_378,&local_3f8,screenWindow,local_41c,local_418);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  FVar1 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0];
  FVar2 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1];
  auVar26 = vxorps_avx512vl(auVar28,auVar28);
  auVar27 = vmulss_avx512f(ZEXT416((uint)FVar2),auVar26);
  auVar28 = vaddss_avx512f(ZEXT416((uint)FVar1),auVar27);
  FVar3 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2];
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar3),auVar26);
  fVar25 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][3];
  auVar29 = vaddss_avx512f(ZEXT416((uint)fVar25),auVar28);
  FVar4 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0];
  FVar5 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1];
  auVar30 = vmulss_avx512f(ZEXT416((uint)FVar5),auVar26);
  auVar28 = vaddss_avx512f(ZEXT416((uint)FVar4),auVar30);
  FVar6 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2];
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar6),auVar26);
  fVar40 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3];
  auVar31 = vaddss_avx512f(ZEXT416((uint)fVar40),auVar28);
  FVar7 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0];
  FVar8 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1];
  auVar32 = vmulss_avx512f(ZEXT416((uint)FVar8),auVar26);
  auVar28 = vaddss_avx512f(ZEXT416((uint)FVar7),auVar32);
  FVar9 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2];
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar9),auVar26);
  fVar38 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar33 = vaddss_avx512f(ZEXT416((uint)fVar38),auVar28);
  FVar10 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0];
  FVar11 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][1];
  auVar34 = vmulss_avx512f(ZEXT416((uint)FVar11),auVar26);
  auVar28 = vaddss_avx512f(ZEXT416((uint)FVar10),auVar34);
  FVar12 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2];
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar12),auVar26);
  FVar13 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3];
  vaddss_avx512f(ZEXT416((uint)FVar13),auVar28);
  auVar28 = vucomiss_avx512f(ZEXT416(0x3f800000));
  bVar21 = (bool)(bVar24 & !(bool)uVar23);
  auVar35 = vdivss_avx512f(auVar29,auVar28);
  auVar36 = vdivss_avx512f(auVar31,auVar28);
  auVar37 = vdivss_avx512f(auVar33,auVar28);
  auVar35._0_4_ = (uint)bVar21 * auVar29._0_4_ + (uint)!bVar21 * auVar35._0_4_;
  auVar29._4_12_ = auVar36._4_12_;
  auVar29._0_4_ = (uint)bVar21 * auVar31._0_4_ + (uint)!bVar21 * auVar36._0_4_;
  auVar28 = vinsertps_avx512f(auVar35,auVar29,0x10);
  auVar31._4_12_ = auVar37._4_12_;
  auVar31._0_4_ = (uint)bVar21 * auVar33._0_4_ + (uint)!bVar21 * auVar37._0_4_;
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)FVar1),auVar26);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)FVar3),auVar26);
  auVar29 = vaddss_avx512f(ZEXT416((uint)fVar25),auVar27);
  auVar27 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)FVar4),auVar26);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)FVar6),auVar26);
  auVar30 = vaddss_avx512f(ZEXT416((uint)fVar40),auVar27);
  auVar27 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)FVar7),auVar26);
  auVar32 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)FVar9),auVar26);
  auVar27 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)FVar10),auVar26);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)FVar12),auVar26);
  vaddss_avx512f(ZEXT416((uint)FVar13),auVar27);
  auVar27 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar32 = vaddss_avx512f(ZEXT416((uint)fVar38),auVar32);
  auVar29 = vdivss_avx512f(auVar29,auVar27);
  auVar30 = vdivss_avx512f(auVar30,auVar27);
  auVar33 = vdivss_avx512f(auVar32,auVar27);
  auVar27 = vinsertps_avx512f(auVar29,auVar30,0x10);
  auVar28 = vsubps_avx512vl(auVar28,auVar27);
  auVar30 = vsubss_avx512f(auVar31,auVar33);
  uVar15 = vmovlps_avx512f(auVar28);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar15;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar30._0_4_;
  auVar28 = vxorps_avx512vl(auVar28,auVar28);
  auVar28 = vfmadd213ss_avx512f(auVar28,ZEXT416((uint)FVar1),ZEXT416((uint)FVar2));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar3),auVar26);
  auVar31 = vaddss_avx512f(ZEXT416((uint)fVar25),auVar28);
  auVar28 = vxorps_avx512vl(auVar30,auVar30);
  auVar28 = vfmadd213ss_avx512f(auVar28,ZEXT416((uint)FVar4),ZEXT416((uint)FVar5));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar6),auVar26);
  auVar30 = vaddss_avx512f(ZEXT416((uint)fVar40),auVar28);
  auVar28 = vxorps_avx512vl(auVar32,auVar32);
  auVar28 = vfmadd213ss_avx512f(auVar28,ZEXT416((uint)FVar7),ZEXT416((uint)FVar8));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar9),auVar26);
  auVar32 = vaddss_avx512f(ZEXT416((uint)fVar38),auVar28);
  auVar28 = vxorps_avx512vl(auVar29,auVar29);
  auVar28 = vfmadd213ss_avx512f(auVar28,ZEXT416((uint)FVar10),ZEXT416((uint)FVar11));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar12),auVar26);
  vaddss_avx512f(ZEXT416((uint)FVar13),auVar28);
  auVar28 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar29 = vdivss_avx512f(auVar31,auVar28);
  auVar30 = vdivss_avx512f(auVar30,auVar28);
  auVar31 = vdivss_avx512f(auVar32,auVar28);
  auVar28 = vinsertps_avx512f(auVar29,auVar30,0x10);
  auVar28 = vsubps_avx512vl(auVar28,auVar27);
  auVar27 = vsubss_avx512f(auVar31,auVar33);
  uVar15 = vmovlps_avx512f(auVar28);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar15;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar27._0_4_;
  uVar16 = *(ulong *)(*(ulong *)(((this->super_ProjectiveCamera).super_CameraBase.film.
                                  super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                                 0xffffffffffff) + 0x18) & 0xffffffffffff);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar16;
  auVar28 = vmovshdup_avx512vl(auVar34);
  auVar27 = vmulss_avx512f(ZEXT416((uint)FVar2),auVar28);
  auVar27 = vfnmsub231ss_avx512f(auVar27,auVar34,ZEXT416((uint)FVar1));
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar26,ZEXT416((uint)FVar3));
  auVar29 = vmulss_avx512f(ZEXT416((uint)FVar5),auVar28);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar16;
  auVar29 = vfnmsub231ss_avx512f(auVar29,auVar36,ZEXT416((uint)FVar4));
  auVar29 = vfmadd231ss_avx512f(auVar29,auVar26,ZEXT416((uint)FVar6));
  auVar30 = vmulss_avx512f(ZEXT416((uint)FVar8),auVar28);
  auVar30 = vfnmsub231ss_avx512f(auVar30,auVar36,ZEXT416((uint)FVar7));
  auVar30 = vfmadd231ss_avx512f(auVar30,auVar26,ZEXT416((uint)FVar9));
  auVar28 = vmulss_avx512f(ZEXT416((uint)FVar11),auVar28);
  auVar28 = vfnmsub231ss_avx512f(auVar28,ZEXT416((uint)FVar10),auVar36);
  vfmadd231ss_avx512f(auVar28,auVar26,ZEXT416((uint)FVar12));
  auVar28 = vucomiss_avx512f(ZEXT416(0x3f800000));
  fVar39 = auVar28._0_4_;
  fVar41 = (fVar40 + auVar29._0_4_) / fVar39;
  fVar40 = (fVar38 + auVar30._0_4_) / fVar39;
  auVar28 = ZEXT416((uint)((fVar25 + auVar27._0_4_) / fVar39));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar41)),auVar28,auVar28);
  vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
  auVar28 = vucomiss_avx512f(auVar26);
  auVar28 = vsqrtss_avx(auVar28,auVar28);
  this->cosTotalWidth = fVar40 / auVar28._0_4_;
  uVar16 = *(ulong *)((this->super_ProjectiveCamera).super_CameraBase.film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff);
  auVar31 = ZEXT416((uint)(float)(int)uVar16);
  bVar21 = uVar16 >> 0x20 == 0;
  bVar17 = (POPCOUNT(uVar16 >> 0x20 & 0xff) & 1U) != 0;
  fVar25 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1];
  auVar28 = vmulss_avx512f(ZEXT416((uint)fVar25),auVar26);
  auVar34 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0]);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar34,auVar26);
  auVar36 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2]);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar36,auVar26);
  fVar40 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][3];
  fVar42 = fVar40 + auVar28._0_4_;
  fVar38 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1];
  auVar28 = vmulss_avx512f(ZEXT416((uint)fVar38),auVar26);
  auVar37 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0]);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar37,auVar26);
  auVar43 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2]);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar43,auVar26);
  fVar39 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3];
  fVar18 = fVar39 + auVar28._0_4_;
  fVar41 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1];
  auVar28 = vmulss_avx512f(ZEXT416((uint)fVar41),auVar26);
  auVar44 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0]);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar44,auVar26);
  auVar45 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2]);
  auVar27 = vfmadd231ss_avx512f(auVar28,auVar45,auVar26);
  fVar14 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar47 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][1]);
  auVar28 = vmulss_avx512f(auVar47,auVar26);
  auVar46 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0]);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar46,auVar26);
  auVar48 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2]);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar48,auVar26);
  auVar49 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3]);
  vaddss_avx512f(auVar49,auVar28);
  auVar28 = vucomiss_avx512f(ZEXT416(0x3f800000));
  fVar19 = fVar14 + auVar27._0_4_;
  bVar22 = bVar21 && bVar17;
  bVar20 = !bVar17;
  auVar27 = vdivss_avx512f(ZEXT416((uint)fVar42),auVar28);
  auVar30._4_12_ = auVar27._4_12_;
  auVar30._0_4_ = (uint)bVar22 * (int)fVar42 + (uint)(!bVar21 || !bVar17) * auVar27._0_4_;
  auVar27 = vdivss_avx512f(ZEXT416((uint)fVar18),auVar28);
  auVar29 = vdivss_avx512f(ZEXT416((uint)fVar19),auVar28);
  auVar32._4_12_ = auVar27._4_12_;
  auVar32._0_4_ = (uint)bVar22 * (int)fVar18 + (uint)(!bVar21 || !bVar17) * auVar27._0_4_;
  auVar28 = vcvtsi2ss_avx512f(auVar35,(int)(uVar16 >> 0x20));
  auVar33._4_12_ = auVar29._4_12_;
  auVar33._0_4_ = (uint)bVar22 * (int)fVar19 + (uint)(!bVar21 || !bVar17) * auVar29._0_4_;
  fVar42 = auVar28._0_4_;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar42 * fVar25)),auVar31,auVar34);
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar26,auVar36);
  fVar40 = fVar40 + auVar27._0_4_;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar42 * fVar38)),auVar31,auVar37);
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar26,auVar43);
  fVar39 = fVar39 + auVar27._0_4_;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar42)),auVar31,auVar44);
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar26,auVar45);
  auVar28 = vmulss_avx512f(auVar47,auVar28);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar46,auVar31);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar48,auVar26);
  vaddss_avx512f(auVar49,auVar28);
  auVar28 = vucomiss_avx512f(ZEXT416(0x3f800000));
  fVar14 = fVar14 + auVar27._0_4_;
  bVar22 = (!bVar21 || bVar20) && bVar22;
  fVar38 = auVar28._0_4_;
  fVar25 = (float)((uint)bVar22 * (int)fVar14 +
                  (uint)(!bVar21 || (!bVar20 || !bVar17)) * (int)(fVar14 / fVar38));
  auVar27 = vdivss_avx512f(auVar30,auVar33);
  auVar26 = vdivss_avx512f(auVar32,auVar33);
  auVar28._8_4_ = 0x7fffffff;
  auVar28._0_8_ = 0x7fffffff7fffffff;
  auVar28._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx512vl(ZEXT416((uint)(((float)((uint)bVar22 * (int)fVar40 +
                                                   (uint)(!bVar21 || (!bVar20 || !bVar17)) *
                                                   (int)(fVar40 / fVar38)) / fVar25 - auVar27._0_4_)
                                          * ((float)((uint)bVar22 * (int)fVar39 +
                                                    (uint)(!bVar21 || (!bVar20 || !bVar17)) *
                                                    (int)(fVar39 / fVar38)) / fVar25 - auVar26._0_4_
                                            ))),auVar28);
  this->A = auVar28._0_4_;
  local_400.
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           )((ulong)this | 0x1000000000000);
  CameraBase::FindMinimumDifferentials((CameraBase *)this,&local_400);
  return;
}

Assistant:

PerspectiveCamera(CameraBaseParameters baseParameters, Float fov,
                      const Bounds2f &screenWindow, Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Perspective(fov, 1e-2f, 1000.f), screenWindow,
                           lensRadius, focalDistance) {
        // Compute differential changes in origin for perspective camera rays
        dxCamera =
            cameraFromRaster(Point3f(1, 0, 0)) - cameraFromRaster(Point3f(0, 0, 0));
        dyCamera =
            cameraFromRaster(Point3f(0, 1, 0)) - cameraFromRaster(Point3f(0, 0, 0));

        // Compute _cosTotalWidth_ for perspective camera
        Point2f radius = Point2f(film.GetFilter().Radius());
        Point3f pCorner(-radius.x, -radius.y, 0.f);
        Vector3f wCornerCamera = Normalize(Vector3f(cameraFromRaster(pCorner)));
        cosTotalWidth = wCornerCamera.z;
        DCHECK_LT(.9999 * cosTotalWidth, std::cos(Radians(fov / 2)));

        // Compute image plane bounds at $z=1$ for _PerspectiveCamera_
        Point2i res = film.FullResolution();
        Point3f pMin = cameraFromRaster(Point3f(0, 0, 0));
        Point3f pMax = cameraFromRaster(Point3f(res.x, res.y, 0));
        pMin /= pMin.z;
        pMax /= pMax.z;
        A = std::abs((pMax.x - pMin.x) * (pMax.y - pMin.y));

        // Compute minimum differentials for _PerspectiveCamera_
        FindMinimumDifferentials(this);
    }